

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::animateScrollIndicators(AbstractScrollAreaPrivate *this)

{
  int iVar1;
  
  QTimer::stop();
  iVar1 = QColor::alpha();
  this->horIndicator->alpha = iVar1;
  iVar1 = QColor::alpha();
  this->vertIndicator->alpha = iVar1;
  QTimer::start((int)this->animationTimer);
  if (this->horIndicator->needPaint == true) {
    this->horIndicator->animate = true;
    QWidget::update();
  }
  if (this->vertIndicator->needPaint == true) {
    this->vertIndicator->animate = true;
    QWidget::update();
    return;
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::animateScrollIndicators()
{
	animationTimer->stop();
	horIndicator->alpha = horIndicator->color.alpha();
	vertIndicator->alpha = vertIndicator->color.alpha();
	animationTimer->start( animationTimeout );

	if( horIndicator->needPaint )
	{
		horIndicator->animate = true;
		horIndicator->update();
	}

	if( vertIndicator->needPaint )
	{
		vertIndicator->animate = true;
		vertIndicator->update();
	}
}